

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int polyscope::sizeInBytes(TextureFormat *f)

{
  TextureFormat *f_local;
  int local_4;
  
  switch(*f) {
  case RGB8:
    local_4 = 3;
    break;
  case RGBA8:
    local_4 = 4;
    break;
  case RG16F:
    local_4 = 4;
    break;
  case RGB16F:
    local_4 = 6;
    break;
  case RGBA16F:
    local_4 = 8;
    break;
  case RGBA32F:
    local_4 = 0x10;
    break;
  case RGB32F:
    local_4 = 0xc;
    break;
  case R32F:
    local_4 = 4;
    break;
  case R16F:
    local_4 = 2;
    break;
  case DEPTH24:
    local_4 = 3;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int sizeInBytes(const TextureFormat& f) {
  // clang-format off
  switch (f) {
    case TextureFormat::RGB8:     return 3*1;
    case TextureFormat::RGBA8:    return 4*1;
    case TextureFormat::RG16F:    return 2*2;
    case TextureFormat::RGB16F:   return 3*2;
    case TextureFormat::RGBA16F:  return 4*2;
    case TextureFormat::R32F:     return 1*4;
    case TextureFormat::R16F:     return 1*2;
    case TextureFormat::RGB32F:   return 3*4;
    case TextureFormat::RGBA32F:  return 4*4;
    case TextureFormat::DEPTH24:  return 1*3;
  }
  // clang-format on
  return -1;
}